

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O1

Point2f __thiscall
pbrt::SphericalMapping2D::Map
          (SphericalMapping2D *this,TextureEvalContext ctx,Vector2f *dstdx,Vector2f *dstdy)

{
  Tuple2<pbrt::Vector2,_float> TVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  Tuple2<pbrt::Point2,_float> TVar9;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Tuple3<pbrt::Point3,_float> local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  TVar9 = (Tuple2<pbrt::Point2,_float>)Sphere(this,&ctx.p);
  auVar14._8_8_ = 0;
  auVar14._0_4_ = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar14._4_4_ = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar7._8_4_ = 0x3dcccccd;
  auVar7._0_8_ = 0x3dcccccd3dcccccd;
  auVar7._12_4_ = 0x3dcccccd;
  auVar7 = vmulps_avx512vl(auVar14,auVar7);
  auVar12._0_4_ = auVar7._0_4_ + ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  auVar12._4_4_ = auVar7._4_4_ + ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  auVar12._8_4_ = auVar7._8_4_ + 0.0;
  auVar12._12_4_ = auVar7._12_4_ + 0.0;
  local_38.z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z * 0.1 +
               ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_38._0_8_ = vmovlps_avx(auVar12);
  auVar10._0_8_ = Sphere(this,(Point3f *)&local_38);
  auVar10._8_56_ = extraout_var;
  auVar5._8_8_ = extraout_XMM0_Qb;
  auVar5._0_4_ = TVar9.x;
  auVar5._4_4_ = TVar9.y;
  auVar7 = vsubps_avx(auVar10._0_16_,auVar5);
  auVar15._8_4_ = 0x3dcccccd;
  auVar15._0_8_ = 0x3dcccccd3dcccccd;
  auVar15._12_4_ = 0x3dcccccd;
  auVar7 = vdivps_avx(auVar7,auVar15);
  TVar1 = (Tuple2<pbrt::Vector2,_float>)vmovlps_avx(auVar7);
  dstdx->super_Tuple2<pbrt::Vector2,_float> = TVar1;
  auVar13._0_4_ =
       ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x * 0.1 +
       ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  auVar13._4_4_ =
       ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y * 0.1 +
       ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  auVar13._8_8_ = 0;
  local_38.z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z * 0.1 +
               ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_38._0_8_ = vmovlps_avx(auVar13);
  auVar11._0_8_ = Sphere(this,(Point3f *)&local_38);
  auVar11._8_56_ = extraout_var_00;
  auVar6._8_8_ = extraout_XMM0_Qb;
  auVar6._0_4_ = TVar9.x;
  auVar6._4_4_ = TVar9.y;
  auVar7 = vsubps_avx(auVar11._0_16_,auVar6);
  auVar2._8_4_ = 0x3dcccccd;
  auVar2._0_8_ = 0x3dcccccd3dcccccd;
  auVar2._12_4_ = 0x3dcccccd;
  auVar7 = vdivps_avx512vl(auVar7,auVar2);
  TVar1 = (Tuple2<pbrt::Vector2,_float>)vmovlps_avx(auVar7);
  dstdy->super_Tuple2<pbrt::Vector2,_float> = TVar1;
  fVar8 = (dstdx->super_Tuple2<pbrt::Vector2,_float>).y;
  if (fVar8 <= 0.5) {
    if (-0.5 <= fVar8) goto LAB_00388a23;
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(ZEXT416((uint)(fVar8 + 1.0)),auVar4);
    fVar8 = auVar7._0_4_;
  }
  else {
    fVar8 = 1.0 - fVar8;
  }
  (dstdx->super_Tuple2<pbrt::Vector2,_float>).y = fVar8;
LAB_00388a23:
  fVar8 = (dstdy->super_Tuple2<pbrt::Vector2,_float>).y;
  if (fVar8 <= 0.5) {
    if (-0.5 <= fVar8) {
      return (Point2f)TVar9;
    }
    auVar3._8_4_ = 0x80000000;
    auVar3._0_8_ = 0x8000000080000000;
    auVar3._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(ZEXT416((uint)(fVar8 + 1.0)),auVar3);
    fVar8 = auVar7._0_4_;
  }
  else {
    fVar8 = 1.0 - fVar8;
  }
  (dstdy->super_Tuple2<pbrt::Vector2,_float>).y = fVar8;
  return (Point2f)TVar9;
}

Assistant:

PBRT_CPU_GPU
    Point2f Map(TextureEvalContext ctx, Vector2f *dstdx, Vector2f *dstdy) const {
        Point2f st = Sphere(ctx.p);
        // Compute texture coordinate differentials for sphere $(u,v)$ mapping
        Float delta = .1f;
        Point2f stDeltaX = Sphere(ctx.p + delta * ctx.dpdx);
        *dstdx = (stDeltaX - st) / delta;
        Point2f stDeltaY = Sphere(ctx.p + delta * ctx.dpdy);
        *dstdy = (stDeltaY - st) / delta;

        // Handle sphere mapping discontinuity for coordinate differentials
        if ((*dstdx)[1] > .5)
            (*dstdx)[1] = 1 - (*dstdx)[1];
        else if ((*dstdx)[1] < -.5f)
            (*dstdx)[1] = -((*dstdx)[1] + 1);
        if ((*dstdy)[1] > .5)
            (*dstdy)[1] = 1 - (*dstdy)[1];
        else if ((*dstdy)[1] < -.5f)
            (*dstdy)[1] = -((*dstdy)[1] + 1);

        return st;
    }